

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_Combos_Test::TestBody(unitStrings_Combos_Test *this)

{
  bool bVar1;
  unit *puVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *__return_storage_ptr__;
  AssertHelper local_140;
  Message local_138;
  unit local_130;
  string local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  unit local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  unit local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  unit local_48;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  unitStrings_Combos_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_48 = units::unit::operator/((unit *)&units::V,(unit *)&units::km);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_40;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_48,puVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_20,"to_string(V / km)","\"mV/m\"",psVar4,(char (*) [5])"mV/m");
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    psVar4 = (string *)0x42;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a0 = units::unit::operator/((unit *)&units::currency,(unit *)&units::MWh);
  puVar2 = (unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_98;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_a0,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_78,"to_string(currency / MWh)","\"$/MWh\"",__return_storage_ptr__,
             (char (*) [6])"$/MWh");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    __return_storage_ptr__ = (string *)0x43;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_e8 = units::unit::operator/((unit *)&units::currency,(unit *)&units::mile);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_e0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_e8,puVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_c0,"to_string(currency / mile)","\"$/mi\"",psVar4,
             (char (*) [5])"$/mi");
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    psVar4 = (string *)0x44;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_130 = units::unit::operator/((unit *)&units::kW,(unit *)&units::gal);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_128,(units *)&local_130,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_108,"to_string(kW / gal)","\"kW/gal\"",&local_128,
             (char (*) [7])"kW/gal");
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TEST(unitStrings, Combos)
{
    EXPECT_EQ(to_string(V / km), "mV/m");
    EXPECT_EQ(to_string(currency / MWh), "$/MWh");
    EXPECT_EQ(to_string(currency / mile), "$/mi");
    EXPECT_EQ(to_string(kW / gal), "kW/gal");
}